

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

uint64_t __thiscall CLIntercept::computeHash(CLIntercept *this,void *ptr,size_t length)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  int iVar8;
  int iVar9;
  
  if (ptr != (void *)0x0) {
    if (length < 4) {
      iVar8 = -0x71374491;
      iVar9 = 0x4a3f0431;
      uVar3 = 0x428a2f98;
      uVar2 = 0xb5c0fbcf;
      uVar6 = 0x71374491;
    }
    else {
      uVar6 = 0x71374491;
      uVar2 = 0xb5c0fbcf;
      uVar3 = 0x428a2f98;
      iVar9 = 0x4a3f0431;
      iVar8 = -0x71374491;
      uVar4 = 0;
      do {
        uVar5 = uVar2 >> 0xd ^ iVar8 + iVar9 + (uVar3 ^ *(uint *)((long)ptr + uVar4 * 4));
        uVar6 = uVar5 << 8 ^ (uVar6 + iVar9) - uVar5;
        uVar3 = uVar6 >> 0xd ^ (uVar2 - uVar5) - uVar6;
        uVar2 = uVar3 >> 0xc ^ (uVar5 - uVar6) - uVar3;
        uVar6 = uVar2 << 0x10 ^ (uVar6 - uVar3) - uVar2;
        uVar5 = uVar6 >> 5 ^ (uVar3 - uVar2) - uVar6;
        uVar3 = uVar5 >> 3 ^ (uVar2 - uVar6) - uVar5;
        uVar6 = uVar3 << 10 ^ (uVar6 - uVar5) - uVar3;
        iVar8 = -uVar6;
        uVar2 = uVar6 >> 0xf ^ (uVar5 - uVar3) - uVar6;
        iVar9 = -uVar2;
        uVar4 = uVar4 + 1;
      } while (length >> 2 != uVar4);
    }
    if ((length & 3) != 0) {
      pbVar7 = (byte *)((long)ptr + (length & 0xfffffffffffffffc));
      uVar4 = 0;
      uVar5 = 0;
      do {
        bVar1 = *pbVar7;
        pbVar7 = pbVar7 + 1;
        uVar5 = uVar5 + ((uint)bVar1 << ((byte)uVar4 & 0x1f));
        uVar4 = uVar4 + 8;
      } while ((uint)((int)(length & 3) << 3) != uVar4);
      uVar3 = uVar2 >> 0xd ^ iVar8 + iVar9 + (uVar5 ^ uVar3);
      uVar6 = uVar3 << 8 ^ (uVar6 + iVar9) - uVar3;
      uVar5 = uVar6 >> 0xd ^ (uVar2 - uVar3) - uVar6;
      uVar2 = uVar5 >> 0xc ^ (uVar3 - uVar6) - uVar5;
      uVar6 = uVar2 << 0x10 ^ (uVar6 - uVar5) - uVar2;
      uVar3 = uVar6 >> 5 ^ (uVar5 - uVar2) - uVar6;
      uVar2 = uVar3 >> 3 ^ (uVar2 - uVar6) - uVar3;
      uVar6 = uVar2 << 10 ^ (uVar6 - uVar3) - uVar2;
      uVar2 = uVar6 >> 0xf ^ uVar3 - (uVar2 + uVar6);
    }
    return CONCAT44(uVar6,uVar2);
  }
  return 0;
}

Assistant:

uint64_t CLIntercept::computeHash(
    const void* ptr,
    size_t length )
{
    uint64_t    hash = 0;

    if( ptr != NULL )
    {
        hash = Hash( ptr, length );
    }

    return hash;
}